

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rudp.cpp
# Opt level: O3

void __thiscall rudp::session::set_null_segment_timer(session *this)

{
  element_type *peVar1;
  service_type *psVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  io_object_impl<boost::asio::detail::deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *this_00;
  wait_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Fadis[P]rudp_src_rudp_cpp:303:7),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *op;
  template_rebind_alloc<wait_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Fadis[P]rudp_src_rudp_cpp:303:7),_any_executor<context_as_t<execution_context_&>,_never_t<0>,_prefer_only<possibly_t<>_>,_prefer_only<tracked_t<>_>,_prefer_only<untracked_t<>_>,_prefer_only<fork_t<>_>,_prefer_only<continuation_t<>_>_>_>_>
  a;
  undefined8 uVar5;
  long in_FS_OFFSET;
  undefined1 local_68 [8];
  element_type *peStack_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  element_type *peStack_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  ptr local_38;
  
  peVar1 = (this->null_segment_timer).
           super___shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    if ((peVar1->impl_).implementation_.might_have_pending_waits == true) {
      psVar2 = (peVar1->impl_).service_;
      boost::asio::detail::epoll_reactor::
      cancel_timer<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,boost::asio::wait_traits<std::chrono::_V2::steady_clock>>>
                (psVar2->scheduler_,&psVar2->timer_queue_,
                 &(peVar1->impl_).implementation_.timer_data,0xffffffffffffffff);
      (peVar1->impl_).implementation_.might_have_pending_waits = false;
    }
    p_Var3 = (this->null_segment_timer).
             super___shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    (this->null_segment_timer).
    super___shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    (this->null_segment_timer).
    super___shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
  }
  this_00 = (io_object_impl<boost::asio::detail::deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
             *)operator_new(0x70);
  boost::asio::detail::
  io_object_impl<boost::asio::detail::deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::io_object_impl<boost::asio::io_context>(this_00,this->io_service,(type *)0x0);
  std::
  __shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::steady_clock,boost::asio::wait_traits<std::chrono::_V2::steady_clock>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,(__gnu_cxx::_Lock_policy)2>
  ::
  reset<boost::asio::basic_waitable_timer<std::chrono::_V2::steady_clock,boost::asio::wait_traits<std::chrono::_V2::steady_clock>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
            ((__shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::steady_clock,boost::asio::wait_traits<std::chrono::_V2::steady_clock>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,(__gnu_cxx::_Lock_policy)2>
              *)&this->null_segment_timer,
             (basic_waitable_timer<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              *)this_00);
  local_68 = (undefined1  [8])
             ((ulong)((uint)(this->self_config).null_segment_timeout_value <<
                     ((this->client ^ 1U) & 0x1f)) * 1000000);
  boost::asio::
  basic_waitable_timer<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::expires_from_now((this->null_segment_timer).
                     super___shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,(duration *)local_68);
  peVar1 = (this->null_segment_timer).
           super___shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_68 = (undefined1  [8])this;
  std::__shared_ptr<rudp::session,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<rudp::session,void>
            ((__shared_ptr<rudp::session,(__gnu_cxx::_Lock_policy)2> *)&peStack_60,
             (__weak_ptr<rudp::session,_(__gnu_cxx::_Lock_policy)2> *)this);
  peStack_50 = (this->null_segment_timer).
               super___shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
  local_48 = (this->null_segment_timer).
             super___shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_48->_M_use_count = local_48->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_48->_M_use_count = local_48->_M_use_count + 1;
    }
  }
  psVar2 = (peVar1->impl_).service_;
  if (*(long *)(in_FS_OFFSET + -8) == 0) {
    uVar5 = 0;
  }
  else {
    uVar5 = *(undefined8 *)(*(long *)(in_FS_OFFSET + -8) + 8);
  }
  local_38.h = (anon_class_40_3_1c35e138 *)local_68;
  op = (wait_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Fadis[P]rudp_src_rudp_cpp:303:7),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
        *)boost::asio::detail::thread_info_base::
          allocate<boost::asio::detail::thread_info_base::default_tag>(uVar5,0x80);
  p_Var4 = local_48;
  p_Var3 = local_58;
  (op->super_wait_op).super_operation.next_ = (scheduler_operation *)0x0;
  (op->super_wait_op).super_operation.func_ =
       boost::asio::detail::
       wait_handler<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/Fadis[P]rudp/src/rudp.cpp:303:7),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
       ::do_complete;
  (op->super_wait_op).super_operation.task_result_ = 0;
  (op->super_wait_op).ec_.val_ = 0;
  (op->super_wait_op).ec_.failed_ = false;
  (op->super_wait_op).ec_.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  (op->handler_).this = (session *)local_68;
  (op->handler_).this_.super___shared_ptr<rudp::session,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peStack_60;
  peStack_60 = (element_type *)0x0;
  local_58 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (op->handler_).this_.super___shared_ptr<rudp::session,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var3;
  (op->handler_).null_segment_timer_.
  super___shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peStack_50;
  local_48 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (op->handler_).null_segment_timer_.
  super___shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var4;
  peStack_50 = (element_type *)0x0;
  local_38.v = op;
  boost::asio::detail::
  handler_work_base<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_void,_boost::asio::io_context,_boost::asio::executor,_void>
  ::handler_work_base(&(op->work_).
                       super_handler_work_base<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_void,_boost::asio::io_context,_boost::asio::executor,_void>
                      ,&(peVar1->impl_).executor_);
  (peVar1->impl_).implementation_.might_have_pending_waits = true;
  local_38.p = op;
  boost::asio::detail::epoll_reactor::
  schedule_timer<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,boost::asio::wait_traits<std::chrono::_V2::steady_clock>>>
            (psVar2->scheduler_,&psVar2->timer_queue_,&(peVar1->impl_).implementation_.expiry,
             &(peVar1->impl_).implementation_.timer_data,(wait_op *)op);
  local_38.v = (wait_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Fadis[P]rudp_src_rudp_cpp:303:7),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                *)0x0;
  local_38.p = (wait_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Fadis[P]rudp_src_rudp_cpp:303:7),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                *)0x0;
  boost::asio::detail::
  wait_handler<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/Fadis[P]rudp/src/rudp.cpp:303:7),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::ptr::reset(&local_38);
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  return;
}

Assistant:

void session::set_null_segment_timer() {
    if( null_segment_timer ) {
      null_segment_timer->cancel();
      null_segment_timer.reset();
    }
    null_segment_timer.reset( new boost::asio::steady_timer( io_service ) );
    null_segment_timer->expires_from_now( std::chrono::milliseconds( self_config.null_segment_timeout_value * ( client ? 1 : 2 ) ) );
    null_segment_timer->async_wait(
      [this,this_=shared_from_this(),null_segment_timer_=null_segment_timer]( const boost::system::error_code &error ) {
        if( !error ) {
          if( null_segment_timer ) {
            null_segment_timer.reset();
          }
          if( client ) {
            if( state == session_state::opened ) send( generate_nul(), false, []( bool ){} );
          }
          else {
            wait_for_tcs();
          }
        }
      }
    );
  }